

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCanon.c
# Opt level: O1

void Aig_RManPrintSigs(Aig_VSig_t *pSigs,int nVars)

{
  ulong uVar1;
  int *piVar2;
  int *piVar3;
  ulong uVar4;
  long lVar5;
  bool bVar6;
  
  if (0 < nVars) {
    piVar2 = pSigs->nCofOnes;
    uVar1 = 0;
    do {
      printf("%2d : ",uVar1 & 0xffffffff);
      piVar3 = piVar2;
      lVar5 = 0;
      do {
        printf("%5d  ",(ulong)(uint)pSigs[uVar1 * 2 + lVar5].nOnes);
        putchar(0x28);
        uVar4 = 0;
        do {
          printf("%4d ",(ulong)(uint)piVar3[uVar4]);
          uVar4 = uVar4 + 1;
        } while ((uint)nVars != uVar4);
        printf(")  ");
        piVar3 = piVar3 + 0xd;
        bVar6 = lVar5 == 0;
        lVar5 = lVar5 + 1;
      } while (bVar6);
      putchar(10);
      uVar1 = uVar1 + 1;
      piVar2 = piVar2 + 0x1a;
    } while (uVar1 != (uint)nVars);
  }
  return;
}

Assistant:

void Aig_RManPrintSigs( Aig_VSig_t * pSigs, int nVars )
{
    int v, i, k;
    for ( v = 0; v < nVars; v++ )
    {
        printf( "%2d : ", v );
        for ( k = 0; k < 2; k++ )
        {
            printf( "%5d  ", pSigs[2*v+k].nOnes );
            printf( "(" );
            for ( i = 0; i < nVars; i++ )
                printf( "%4d ", pSigs[2*v+k].nCofOnes[i] );
            printf( ")  " );
        }
        printf( "\n" );
    }
}